

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void CVmObjBigNum::round_up_abs(char *ext,int keep_digits)

{
  uint uVar1;
  uint in_ESI;
  char *in_RDI;
  int d;
  int idx;
  int carry;
  int in_stack_ffffffffffffffdc;
  char *ext_00;
  int iVar2;
  uint uVar3;
  
  iVar2 = 1;
  uVar3 = in_ESI;
  do {
    if (in_ESI == 0) {
LAB_002be66c:
      if (iVar2 != 0) {
        shift_right((char *)CONCAT44(uVar3,iVar2),in_ESI);
        ext_00 = in_RDI;
        get_exp((char *)0x2be696);
        set_exp(ext_00,in_stack_ffffffffffffffdc);
        set_dig(in_RDI,0,1);
      }
      in_RDI[4] = in_RDI[4] & 0xf7;
      return;
    }
    in_ESI = in_ESI - 1;
    uVar1 = get_dig(in_RDI,(long)(int)in_ESI);
    if ((int)uVar1 < 9) {
      set_dig(in_RDI,(long)(int)in_ESI,uVar1 + 1);
      iVar2 = 0;
      goto LAB_002be66c;
    }
    set_dig(in_RDI,(long)(int)in_ESI,0);
  } while( true );
}

Assistant:

void CVmObjBigNum::round_up_abs(char *ext, int keep_digits)
{
    /* start with a "carry" into the least significant digit */
    int carry = TRUE;

    /* propagate the carry through the number's digits */
    for (int idx = keep_digits ; idx != 0 ; )
    {
        /* move to the next more significant digit */
        --idx;

        /* add the carry */
        int d = get_dig(ext, idx);
        if (d < 9)
        {
            /* bump it up */
            set_dig(ext, idx, d + 1);

            /* no carrying required, so we can stop now */
            carry = FALSE;
            break;
        }
        else
        {
            /* it's a '9', so bump it up to '0' and carry to the next digit */
            set_dig(ext, idx, 0);
        }
    }

    /* 
     *   If we carried out of the top digit, we must have had all nines, in
     *   which case we now have all zeros.  Put a 1 in the first digit and
     *   increase the exponent to renormalize. 
     */
    if (carry)
    {
        /* shift the mantissa */
        shift_right(ext, 1);

        /* increase the exponent */
        set_exp(ext, get_exp(ext) + 1);
        
        /* set the lead digit to 1 */
        set_dig(ext, 0, 1);
    }

    /* we know the value is non-zero now */
    ext[VMBN_FLAGS] &= ~VMBN_F_ZERO;
}